

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_linalg.c
# Opt level: O0

void ATy(CUPDLPwork *w,CUPDLPvec *aty,CUPDLPvec *y)

{
  int iVar1;
  undefined8 *in_RDI;
  CUPDLPwork *w_00;
  double dVar2;
  CUPDLPdata *d;
  cupdlp_float begin;
  uint in_stack_ffffffffffffffd0;
  
  w_00 = (CUPDLPwork *)getTimeStamp();
  iVar1 = *(int *)(*(cupdlp_float **)*in_RDI + 5);
  if (iVar1 == 0) {
    ATyCPU(w_00,*(cupdlp_float **)*in_RDI,(cupdlp_float *)(ulong)in_stack_ffffffffffffffd0);
    dVar2 = getTimeStamp();
    *(double *)(in_RDI[6] + 0x28) = (dVar2 - (double)w_00) + *(double *)(in_RDI[6] + 0x28);
    *(int *)(in_RDI[6] + 0x48) = *(int *)(in_RDI[6] + 0x48) + 1;
    return;
  }
  if (iVar1 != 1) {
    if (iVar1 != 2) {
      printf("Error: Unknown device type in ATy\n");
      exit(1);
    }
    printf("GPU not supported in CPU build\n");
    exit(1);
  }
  printf("GPU not supported in CPU build\n");
  exit(1);
}

Assistant:

void ATy(CUPDLPwork *w, CUPDLPvec *aty, const CUPDLPvec *y)

{
  cupdlp_float begin = getTimeStamp();

  CUPDLPdata *d = w->problem->data;
  switch (d->device) {
    case CPU:
      ATyCPU(w, aty->data, y->data);
      break;
    case SINGLE_GPU:
#ifndef CUPDLP_CPU
      ATy_single_gpu(w, y->cuda_vec, aty->cuda_vec);
#else
      printf("GPU not supported in CPU build\n");
      exit(1);
#endif
      break;
    case MULTI_GPU:
#ifndef CUPDLP_CPU
      ATy_multi_gpu(d, aty->data, y->data);
#else
      printf("GPU not supported in CPU build\n");
      exit(1);
#endif
      break;
    default:
      printf("Error: Unknown device type in ATy\n");
      exit(1);
  }
#if PDHG_USE_TIMERS
  w->timers->dAtyTime += getTimeStamp() - begin;
  w->timers->nAtyCalls++;
#endif
}